

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanePart.cpp
# Opt level: O0

vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_> * __thiscall
PlanePart::nextPlanePartPossible
          (vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
           *__return_storage_ptr__,PlanePart *this,bool action)

{
  PlanePart local_250;
  double local_220;
  pair<double,_PlanePart> local_218;
  PlanePart local_1e0;
  pair<double,_PlanePart> local_1b0;
  PlanePart local_178;
  double local_148;
  pair<double,_PlanePart> local_140;
  PlanePart local_108;
  pair<double,_PlanePart> local_d8;
  PlanePart local_90;
  int local_5c;
  pair<double,_PlanePart> local_58;
  undefined1 local_1a;
  byte local_19;
  PlanePart *pPStack_18;
  bool action_local;
  PlanePart *this_local;
  vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
  *PlanePartWithProba;
  
  local_1a = 0;
  local_19 = action;
  pPStack_18 = this;
  this_local = (PlanePart *)__return_storage_ptr__;
  std::vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>::vector
            (__return_storage_ptr__);
  if ((local_19 & 1) == 0) {
    if ((this->whichPente & 1U) == 0) {
      PlanePart(&local_108,this->frequency + this->pente0,false);
      std::pair<double,_PlanePart>::pair<PlanePart,_true>(&local_d8,&this->probaP0,&local_108);
      std::vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>::
      push_back(__return_storage_ptr__,&local_d8);
      local_148 = 1.0 - this->probaP0;
      PlanePart(&local_178,this->frequency + this->pente1,true);
      std::pair<double,_PlanePart>::pair<double,_PlanePart,_true>(&local_140,&local_148,&local_178);
      std::vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>::
      push_back(__return_storage_ptr__,&local_140);
    }
    else {
      local_5c = 1;
      PlanePart(&local_90,this->frequency + this->pente1,(bool)(this->whichPente & 1));
      std::pair<double,_PlanePart>::pair<int,_PlanePart,_true>(&local_58,&local_5c,&local_90);
      std::vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>::
      push_back(__return_storage_ptr__,&local_58);
    }
  }
  else {
    PlanePart(&local_1e0,this->pente0,false);
    std::pair<double,_PlanePart>::pair<PlanePart,_true>(&local_1b0,&this->probaP0,&local_1e0);
    std::vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>::
    push_back(__return_storage_ptr__,&local_1b0);
    local_220 = 1.0 - this->probaP0;
    PlanePart(&local_250,this->pente1,true);
    std::pair<double,_PlanePart>::pair<double,_PlanePart,_true>(&local_218,&local_220,&local_250);
    std::vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>::
    push_back(__return_storage_ptr__,&local_218);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<pair<double,PlanePart>> PlanePart::nextPlanePartPossible(bool action) const {
    vector<pair<double,PlanePart>> PlanePartWithProba;

    // Cas où on ne change pas la pièce
    if (!action) {
        // Cas où l'on est sur la pente haute
        if (whichPente) {
            PlanePartWithProba.push_back(pair<double,PlanePart>(1, PlanePart(frequency + pente1, whichPente)));
        }
        // Cas où l'on est sur la pente basse
        else {
            // On reste sur la pente basse...
            PlanePartWithProba.push_back(pair<double,PlanePart>(probaP0, PlanePart(frequency + pente0, false)));
            // ... ou on bascule sur la pente haute
            PlanePartWithProba.push_back(pair<double,PlanePart>(1 - probaP0, PlanePart(frequency + pente1, true)));
        }
    }

    // Cas où l'n change la pièce
    else {
        // La fréquence est remise à 0 mais un vol est tout de même effectué
        // On reste sur la pente basse...
        PlanePartWithProba.push_back(pair<double,PlanePart>(probaP0, PlanePart(pente0, false)));
        // ... ou on bascule sur la pente haute
        PlanePartWithProba.push_back(pair<double,PlanePart>(1 - probaP0, PlanePart(pente1, true)));
    }

    return PlanePartWithProba;
}